

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int attrset_get_attr(BigAttrSet *attrset,char *attrname,void *data,char *dtype,int nmemb)

{
  int iVar1;
  BigAttr *pBVar2;
  BigAttr *found;
  int nmemb_local;
  char *dtype_local;
  void *data_local;
  char *attrname_local;
  BigAttrSet *attrset_local;
  
  pBVar2 = attrset_lookup_attr(attrset,attrname);
  if (pBVar2 == (BigAttr *)0x0) {
    _big_file_raise("attr not found",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x6de);
  }
  else {
    if (pBVar2->nmemb == nmemb) {
      iVar1 = dtype_convert_simple(data,dtype,pBVar2->data,pBVar2->dtype,(long)pBVar2->nmemb);
      return iVar1;
    }
    _big_file_raise("attr nmemb mismatch",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x6df);
  }
  return -1;
}

Assistant:

static int
attrset_get_attr(BigAttrSet * attrset, const char * attrname, void * data, const char * dtype, int nmemb)
{
    BigAttr * found = attrset_lookup_attr(attrset, attrname);
    RAISEIF(!found, ex_notfound, "attr not found");
    RAISEIF(found->nmemb != nmemb, ex_mismatch, "attr nmemb mismatch");
    return dtype_convert_simple(data, dtype, found->data, found->dtype, found->nmemb);

ex_mismatch:
ex_notfound:
    return -1;
}